

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::OperatorShaderEvaluator::evaluate
          (OperatorShaderEvaluator *this,ShaderEvalContext *ctx)

{
  float fVar1;
  int i;
  long lVar2;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float local_38 [4];
  undefined8 local_28;
  undefined8 uStack_20;
  
  (*this->m_evalFunc)(ctx);
  fVar1 = this->m_scale;
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  lVar2 = 0;
  do {
    local_38[lVar2] = (ctx->color).m_data[lVar2] * fVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  fVar1 = this->m_bias;
  local_28 = 0;
  uStack_20 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_28 + lVar2 * 4) = local_38[lVar2] + fVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *(undefined8 *)(ctx->color).m_data = local_28;
  *(undefined8 *)((ctx->color).m_data + 2) = uStack_20;
  return;
}

Assistant:

virtual void evaluate (ShaderEvalContext& ctx)
	{
		m_evalFunc(ctx);
		ctx.color = ctx.color * m_scale + m_bias;
	}